

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanobenchmark.cc
# Opt level: O0

void __thiscall
highwayhash::(anonymous_namespace)::DurationSamples::
Reduce<highwayhash::MeasureDurations(unsigned_long(*)(void_const*,unsigned_long),highwayhash::DurationsForInputs*,unsigned_char_const*)::__1>
          (DurationSamples *this,anon_class_16_2_4824b9f2 *lambda)

{
  FuncInput input_00;
  bool bVar1;
  uint duration_00;
  reference ppVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  iterator __first;
  iterator __last;
  uint *sorted;
  size_type num_values;
  Duration duration;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *samples;
  FuncInput input;
  pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *input_and_samples;
  iterator __end3;
  iterator __begin3;
  map<unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *__range3;
  anon_class_16_2_4824b9f2 *lambda_local;
  DurationSamples *this_local;
  
  __end3 = std::
           map<unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::begin((map<unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                    *)(this + 8));
  input_and_samples =
       (pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
       std::
       map<unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::end((map<unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              *)(this + 8));
  while( true ) {
    bVar1 = std::operator!=(&__end3,(_Self *)&input_and_samples);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator*(&__end3);
    input_00 = ppVar2->first;
    this_00 = &ppVar2->second;
    __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_00);
    __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__first._M_current,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__last._M_current);
    sorted = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(this_00);
    num_values = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
    duration_00 = Mode<unsigned_int>(sorted,num_values);
    MeasureDurations::anon_class_16_2_4824b9f2::operator()(lambda,input_00,duration_00);
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator++(&__end3);
  }
  return;
}

Assistant:

void Reduce(const Lambda& lambda) {
    for (auto& input_and_samples : samples_for_input_) {
      const FuncInput input = input_and_samples.first;
      std::vector<Duration>& samples = input_and_samples.second;

      NANOBENCHMARK_CHECK(samples.size() <= num_samples_);
      std::sort(samples.begin(), samples.end());
      const Duration duration = Mode(samples.data(), samples.size());
      lambda(input, duration);
    }
  }